

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta)

{
  int iVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar2;
  undefined8 uVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  bool bVar9;
  undefined8 extraout_RAX;
  long lVar10;
  _Head_base<0UL,_int_*,_false> _Var11;
  long lVar12;
  uint uVar13;
  type it;
  int *piVar14;
  rc_data *__last;
  int iVar15;
  rc_data *ret;
  rc_data *__first;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  longdouble in_ST0;
  longdouble lVar21;
  longdouble in_ST1;
  longdouble lVar22;
  longdouble lVar23;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar24;
  undefined1 local_a0 [20];
  int local_8c;
  ulong local_88;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_80;
  solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
  *local_78;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_70;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_68;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  long local_58;
  unique_ptr<int[],_std::default_delete<int[]>_> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  longdouble local_3c;
  
  local_3c = theta;
  if ((first->current)._M_current != (last->current)._M_current) {
    local_78 = this + 8;
    lVar22 = kappa / ((longdouble)1 - kappa);
    lVar23 = in_ST5;
    local_68 = first;
    local_60 = last;
    do {
      iVar15 = (local_68->current)._M_current[-1];
      if (*(int *)(this + 0x80) <= iVar15) {
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
LAB_001af063:
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_80._M_head_impl = (row_value *)(long)iVar15;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_a0,(int)local_78);
      if (local_a0._8_8_ != local_a0._0_8_) {
        lVar20 = *(long *)(this + 0x68);
        _Var11._M_head_impl = (int *)local_a0._8_8_;
        do {
          *(longdouble *)(lVar20 + (long)*_Var11._M_head_impl * 0x10) =
               *(longdouble *)(lVar20 + (long)*_Var11._M_head_impl * 0x10) * local_3c;
          _Var11._M_head_impl = _Var11._M_head_impl + 8;
          lVar23 = in_ST5;
        } while (_Var11._M_head_impl != (int *)local_a0._0_8_);
      }
      if (local_a0._8_8_ == local_a0._0_8_) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        piVar14 = (int *)local_a0._8_8_;
        lVar21 = in_ST0;
        lVar4 = in_ST1;
        lVar5 = in_ST2;
        lVar6 = in_ST3;
        lVar7 = in_ST4;
        lVar8 = in_ST5;
        in_ST5 = lVar23;
        do {
          in_ST4 = lVar8;
          in_ST3 = lVar7;
          in_ST2 = lVar6;
          in_ST1 = lVar5;
          in_ST0 = lVar4;
          sparse_matrix<int>::column((sparse_matrix<int> *)&local_50,(int)local_78);
          lVar23 = (longdouble)0;
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_48._M_head_impl !=
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            lVar23 = (longdouble)0;
            do {
              local_8c = *(int *)(*(long *)(this + 0x48) + (long)*local_48._M_head_impl * 4);
              lVar23 = *(longdouble *)(*(long *)(this + 0x68) + (long)*local_48._M_head_impl * 0x10)
                       * (longdouble)local_8c + lVar23;
              local_48._M_head_impl = local_48._M_head_impl + 2;
              in_ST5 = in_ST4;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_48._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
          }
          lVar20 = *(long *)(this + 0x50);
          lVar19 = uVar18 * 0x20;
          *(int *)(lVar20 + 0x10 + lVar19) = (int)uVar18;
          uVar17 = *(uint *)(*(long *)(this + 0x48) + (long)*piVar14 * 4);
          *(uint *)(lVar20 + 0x14 + lVar19) = uVar17;
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x70),
                     (quadratic_cost_type<long_double> *)(ulong)*(uint *)(local_a0._8_8_ + 4),(int)x
                     ,(bit_array *)(ulong)uVar17);
          *(longdouble *)(*(long *)(this + 0x50) + lVar19) = lVar21 - lVar23;
          piVar14 = piVar14 + 2;
          uVar18 = uVar18 + 1;
          lVar21 = in_ST0;
          lVar4 = in_ST1;
          lVar5 = in_ST2;
          lVar6 = in_ST3;
          lVar7 = in_ST4;
          lVar8 = in_ST5;
          lVar23 = in_ST5;
        } while (piVar14 != (int *)local_a0._0_8_);
      }
      uVar17 = (uint)uVar18;
      uVar18 = uVar18 & 0xffffffff;
      if (1 < uVar17) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + uVar18,(int)LZCOUNT(uVar18) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + uVar18);
        __last = __first + 1;
        lVar20 = uVar18 * 0x20 + -0x20;
        do {
          lVar23 = in_ST5;
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar20 = lVar20 + -0x20;
        } while (lVar20 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      local_70._M_head_impl = (col_value *)((long)local_80._M_head_impl * 3);
      local_88 = uVar18;
      if (*(int *)(*(long *)(this + 0x58) + (long)local_80._M_head_impl * 0xc) < 1) {
        iVar15 = 0;
        uVar18 = 0xffffffff;
      }
      else {
        lVar20 = 0;
        iVar15 = 0;
        uVar16 = 0xffffffffffffffff;
        do {
          uVar3 = local_a0._8_8_;
          uVar18 = uVar16 + 1;
          iVar15 = iVar15 + *(int *)(*(long *)(this + 0x50) + 0x14 + lVar20);
          iVar1 = *(int *)(*(long *)(this + 0x58) + (long)local_70._M_head_impl * 4);
          lVar19 = (long)*(int *)(*(long *)(this + 0x50) + 0x10 + lVar20);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_a0._8_8_ + (lVar19 * 2 + 1) * 4));
          *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)(uVar3 + lVar19 * 2 * 4) * 0x10) =
               *(longdouble *)
                (*(long *)(this + 0x68) + (long)*(int *)(uVar3 + lVar19 * 2 * 4) * 0x10) +
               delta + lVar22 * *(longdouble *)(*(long *)(this + 0x50) + lVar20) * (longdouble)0.5;
          if (iVar1 <= iVar15) break;
          lVar20 = lVar20 + 0x20;
          bVar9 = (long)uVar16 < (long)(int)uVar17 + -2;
          uVar16 = uVar18;
        } while (bVar9);
        uVar17 = (uint)local_88;
        lVar23 = in_ST5;
      }
      uVar13 = (uint)uVar18;
      if (iVar15 < *(int *)(*(long *)(this + 0x58) + (long)local_70._M_head_impl * 4)) {
        bVar9 = false;
      }
      else {
        bVar9 = iVar15 <= *(int *)(*(long *)(this + 0x58) + (long)local_70._M_head_impl * 4 + 4);
      }
      if (((int)(uVar13 + 1) < (int)uVar17) && (bVar9)) {
        local_58 = (long)(int)uVar17;
        lVar20 = (long)(int)uVar13 << 5;
        lVar19 = (long)(int)uVar13 + 2;
        do {
          uVar3 = local_a0._8_8_;
          lVar10 = *(long *)(this + 0x50);
          iVar15 = iVar15 + *(int *)(lVar10 + 0x34 + lVar20);
          if (iVar15 < *(int *)(*(long *)(this + 0x58) + (long)local_70._M_head_impl * 4)) {
            bVar9 = false;
          }
          else {
            bVar9 = iVar15 <= *(int *)(*(long *)(this + 0x58) + (long)local_70._M_head_impl * 4 + 4)
            ;
          }
          lVar12 = (long)*(int *)(lVar10 + 0x30 + lVar20);
          if (bVar9) {
            lVar23 = *(longdouble *)(lVar10 + 0x20 + lVar20);
            lVar21 = (longdouble)0;
            if ((lVar23 != lVar21) || (NAN(lVar23) || NAN(lVar21))) {
              bVar9 = lVar23 < lVar21;
            }
            else {
              dVar24 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar9 = dVar24 < 0.5;
            }
          }
          if (bVar9) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar3 + (lVar12 * 2 + 1) * 4));
            lVar10 = *(long *)(this + 0x68);
            lVar12 = (long)*(int *)(uVar3 + lVar12 * 2 * 4) * 0x10;
            lVar23 = *(longdouble *)(lVar10 + lVar12) +
                     delta + lVar22 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar20) *
                                      (longdouble)0.5;
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar3 + (lVar12 * 2 + 1) * 4));
            lVar10 = *(long *)(this + 0x68);
            lVar12 = (long)*(int *)(uVar3 + lVar12 * 2 * 4) * 0x10;
            lVar23 = *(longdouble *)(lVar10 + lVar12) -
                     (delta + lVar22 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar20) *
                                       (longdouble)0.5);
          }
          *(longdouble *)(lVar10 + lVar12) = lVar23;
          bVar2 = lVar19 < local_58;
          uVar13 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar13;
          lVar20 = lVar20 + 0x20;
          lVar19 = lVar19 + 1;
          lVar23 = in_ST5;
        } while ((bool)(bVar2 & bVar9));
      }
      if ((int)(uVar13 + 1) < (int)local_88) {
        lVar20 = (long)(int)uVar13 << 5;
        iVar15 = ~uVar13 + (int)local_88;
        do {
          uVar3 = local_a0._8_8_;
          lVar19 = (long)*(int *)(*(long *)(this + 0x50) + 0x30 + lVar20);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_a0._8_8_ + (lVar19 * 2 + 1) * 4));
          *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)(uVar3 + lVar19 * 2 * 4) * 0x10) =
               *(longdouble *)
                (*(long *)(this + 0x68) + (long)*(int *)(uVar3 + lVar19 * 2 * 4) * 0x10) -
               (delta + *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar20) * (longdouble)0.5 *
                        lVar22);
          lVar20 = lVar20 + 0x20;
          iVar15 = iVar15 + -1;
          in_ST5 = in_ST4;
          lVar23 = in_ST4;
        } while (iVar15 != 0);
      }
      bVar9 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                          *)this,(int)local_80._M_head_impl,x);
      if (!bVar9) goto LAB_001af063;
      piVar14 = (local_68->current)._M_current + -1;
      (local_68->current)._M_current = piVar14;
    } while (piVar14 != (local_60->current)._M_current);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }